

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Bool prvTidyFixDocType(TidyDocImpl *doc)

{
  uint uVar1;
  Lexer *pLVar2;
  bool bVar3;
  uint uVar4;
  Node *node;
  AttVal *pAVar5;
  tmbstr ptVar6;
  Node *element;
  long lVar7;
  Node *pNVar8;
  ctmbstr ptVar9;
  int iVar10;
  bool bVar11;
  
  pLVar2 = doc->lexer;
  pNVar8 = (doc->root).content;
  for (element = pNVar8; element != (Node *)0x0; element = element->next) {
    if (element->type == DocTypeTag) {
      iVar10 = *(int *)((doc->config).value + 0xe);
      if (iVar10 == 1) {
        prvTidyDiscardElement(doc,element);
        goto LAB_0014697e;
      }
      if (iVar10 == 2) {
        bVar3 = true;
        if (pLVar2->doctype == 0x60000) {
          pLVar2->versionEmitted = 0x20000;
          return yes;
        }
        goto LAB_001468e1;
      }
      if (*(int *)((doc->config).value + 100) != 0) {
        return yes;
      }
      goto LAB_001469b2;
    }
  }
  iVar10 = *(int *)((doc->config).value + 0xe);
  if (iVar10 == 1) {
LAB_0014697e:
    uVar4 = prvTidyApparentVersion(doc);
    pLVar2->versionEmitted = uVar4;
    return yes;
  }
  if (iVar10 == 2) {
    element = (Node *)0x0;
    bVar3 = false;
LAB_001468e1:
    uVar1 = pLVar2->doctype;
    if ((pLVar2->versions & uVar1) != 0) {
      if ((uVar1 & 0x41f00) == 0) goto LAB_00146aeb;
      if (pLVar2->isvoyager != no && pNVar8 != (Node *)0x0) {
        do {
          if (pNVar8->type == DocTypeTag) {
            pLVar2->versionEmitted = uVar1;
            return yes;
          }
          pNVar8 = pNVar8->next;
LAB_00146aeb:
        } while (pNVar8 != (Node *)0x0);
      }
    }
    if (*(int *)((doc->config).value + 100) != 0) {
      return yes;
    }
    bVar11 = true;
    iVar10 = 2;
    if (bVar3) {
LAB_001469b2:
      pAVar5 = prvTidyGetAttrByName(element,"SYSTEM");
      bVar11 = pAVar5 == (AttVal *)0x0;
      if (iVar10 - 3U < 2) {
        prvTidyDiscardElement(doc,element);
        goto LAB_001469db;
      }
      goto LAB_001469de;
    }
switchD_001469f7_caseD_2:
    uVar4 = prvTidyHTMLVersion(doc);
    pLVar2->versionEmitted = uVar4;
    if (uVar4 == 0) {
      return no;
    }
  }
  else {
    if (*(int *)((doc->config).value + 100) != 0) {
      return yes;
    }
    bVar11 = true;
LAB_001469db:
    element = (Node *)0x0;
LAB_001469de:
    switch(iVar10) {
    case 0:
      uVar4 = 0x20000;
      break;
    default:
      pLVar2->versionEmitted = 0;
      return no;
    case 2:
      goto switchD_001469f7_caseD_2;
    case 3:
      uVar4 = 0x20;
      break;
    case 4:
      uVar4 = 0x40;
    }
    pLVar2->versionEmitted = uVar4;
  }
  if (element == (Node *)0x0) {
    element = NewDocTypeNode(doc);
    ptVar6 = prvTidytmbstrdup(doc->allocator,"html");
  }
  else {
    ptVar6 = prvTidytmbstrtolower(element->element);
  }
  element->element = ptVar6;
  lVar7 = 0x18;
  ptVar9 = (ctmbstr)0x0;
  do {
    if (*(uint *)((long)&PTR_prvTidyParseBlock_001c7ac8 + lVar7 + 4) == uVar4) {
      ptVar9 = *(ctmbstr *)((long)&W3C_Doctypes[0].score + lVar7);
      break;
    }
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0x310);
  prvTidyRepairAttrValue(doc,element,"PUBLIC",ptVar9);
  if (!bVar11) {
    lVar7 = 0x20;
    ptVar9 = (ctmbstr)0x0;
    do {
      if (*(uint *)((long)&PTR_prvTidyParseBlock_001c7ac0 + lVar7 + 4) == uVar4) {
        ptVar9 = *(ctmbstr *)((long)&W3C_Doctypes[0].score + lVar7);
        break;
      }
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 0x318);
    prvTidyRepairAttrValue(doc,element,"SYSTEM",ptVar9);
  }
  return yes;
}

Assistant:

Bool TY_(FixDocType)( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    Node* doctype = TY_(FindDocType)( doc );
    uint dtmode = cfg( doc, TidyDoctypeMode );
    uint guessed = VERS_UNKNOWN;
    Bool hadSI = no;

    /* Issue #167 - found doctype, and doctype is default VERS_HTML5, set VERS_HTML5 and return yes */
    if (doctype && (dtmode == TidyDoctypeAuto) &&
        (lexer->doctype == VERS_HTML5) )
    {
        /* The version emitted cannot be a composite value! */
        lexer->versionEmitted = HT50;
        return yes;
    }
    if (dtmode == TidyDoctypeAuto &&
        lexer->versions & lexer->doctype &&
        !(VERS_XHTML & lexer->doctype && !lexer->isvoyager)
        && TY_(FindDocType)(doc))
    {
        lexer->versionEmitted = lexer->doctype;
        return yes;
    }

    if (dtmode == TidyDoctypeOmit)
    {
        if (doctype)
            TY_(DiscardElement)( doc, doctype );
        lexer->versionEmitted = TY_(ApparentVersion)( doc );
        return yes;
    }

    if (cfgBool(doc, TidyXmlOut))
        return yes;

    if (doctype)
        hadSI = TY_(GetAttrByName)(doctype, "SYSTEM") != NULL;

    if ((dtmode == TidyDoctypeStrict ||
         dtmode == TidyDoctypeLoose) && doctype)
    {
        TY_(DiscardElement)(doc, doctype);
        doctype = NULL;
    }

    switch (dtmode)
    {
    case TidyDoctypeHtml5:
        guessed = HT50;
        break;
    case TidyDoctypeStrict:
        guessed = H41S;
        break;
    case TidyDoctypeLoose:
        guessed = H41T;
        break;
    case TidyDoctypeAuto:
        guessed = TY_(HTMLVersion)(doc);
        break;
    }

    lexer->versionEmitted = guessed;
    if (guessed == VERS_UNKNOWN)
        return no;

    if (doctype)
    {
        doctype->element = TY_(tmbstrtolower)(doctype->element);
    }
    else
    {
        doctype = NewDocTypeNode(doc);
        doctype->element = TY_(tmbstrdup)(doc->allocator, "html");
    }

    TY_(RepairAttrValue)(doc, doctype, "PUBLIC", GetFPIFromVers(guessed));

    if (hadSI)
        TY_(RepairAttrValue)(doc, doctype, "SYSTEM", GetSIFromVers(guessed));

    return yes;
}